

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O0

void __thiscall UDPServer::on_upload(UDPServer *this,Poll *poll,Complex *complex)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<Alarm> *this_02;
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  ostream *this_03;
  void *this_04;
  Complex local_310;
  allocator<char> local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  Complex ok;
  string nil;
  weak_ptr<TCPServer> local_238;
  Poll *local_228;
  string local_220 [32];
  shared_ptr<SharedDirectory> local_200;
  undefined1 local_1ec [12];
  shared_ptr<Alarm> alarm;
  weak_ptr<TCPServer> server;
  string local_1b8;
  path local_198;
  SessionFactory local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  shared_ptr<TCPServer> tcp;
  shared_ptr<SharedDirectory> sdir;
  Simple local_e8;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  Simple dto;
  undefined1 local_40 [8];
  string file_name;
  Complex *complex_local;
  Poll *poll_local;
  UDPServer *this_local;
  
  file_name.field_2._8_8_ = complex;
  std::__cxx11::string::string((string *)local_40,(string *)&complex->payload);
  peVar4 = std::__shared_ptr_access<SharedDirectory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SharedDirectory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->dir);
  bVar2 = SharedDirectory::can_create_file
                    (peVar4,*(uint64_t *)(file_name.field_2._8_8_ + 0x12),(string *)local_40);
  if (bVar2) {
    peVar4 = std::__shared_ptr_access<SharedDirectory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SharedDirectory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->dir);
    SharedDirectory::reserve_file
              (peVar4,(string *)local_40,*(uint64_t *)(file_name.field_2._8_8_ + 0x12));
    std::shared_ptr<SharedDirectory>::shared_ptr
              ((shared_ptr<SharedDirectory> *)
               &tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&this->dir
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"FileUploadServer-",&local_151);
    std::operator+(&local_130,&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    peVar4 = std::__shared_ptr_access<SharedDirectory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SharedDirectory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->dir);
    std::__cxx11::string::string((string *)&local_1b8,(string *)local_40);
    SharedDirectory::path_in_dir(&local_198,peVar4,&local_1b8);
    FileReceiveSession::create_session_factory(&local_178,&local_198);
    std::
    make_shared<TCPServer,std::__cxx11::string,std::function<std::shared_ptr<Subscriber>(Poll&,TCPServer&,sockaddr_in)>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
               (function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)> *)
               &local_130);
    std::function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)>::~function
              (&local_178);
    boost::filesystem::path::~path(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    this_00 = &server.super___weak_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<Subscriber>::shared_ptr<TCPServer,void>
              ((shared_ptr<Subscriber> *)this_00,(shared_ptr<TCPServer> *)local_110);
    Poll::subscribe(poll,(shared_ptr<Subscriber> *)this_00);
    std::shared_ptr<Subscriber>::~shared_ptr
              ((shared_ptr<Subscriber> *)
               &server.super___weak_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this_01 = &alarm.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::weak_ptr<TCPServer>::weak_ptr<TCPServer,void>
              ((weak_ptr<TCPServer> *)this_01,(shared_ptr<TCPServer> *)local_110);
    local_1ec._0_4_ = this->timeout * 1000;
    std::weak_ptr<TCPServer>::weak_ptr(&local_238,(weak_ptr<TCPServer> *)this_01);
    local_228 = poll;
    std::__cxx11::string::string(local_220,(string *)local_40);
    std::shared_ptr<SharedDirectory>::shared_ptr
              (&local_200,
               (shared_ptr<SharedDirectory> *)
               &tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::make_shared<Alarm,int,UDPServer::on_upload(Poll&,dto::Complex&)::__0>
              ((int *)(local_1ec + 4),(anon_class_72_4_83ab143c *)local_1ec);
    on_upload(Poll&,dto::Complex&)::$_0::~__0((__0 *)&local_238);
    this_02 = (shared_ptr<Alarm> *)((long)&nil.field_2 + 8);
    std::shared_ptr<Alarm>::shared_ptr(this_02,(shared_ptr<Alarm> *)(local_1ec + 4));
    Poll::subscribe_alarm(poll,this_02);
    std::shared_ptr<Alarm>::~shared_ptr((shared_ptr<Alarm> *)((long)&nil.field_2 + 8));
    std::__cxx11::string::string((string *)(ok.payload.field_2._M_local_buf + 8));
    uVar1 = *(uint64_t *)(file_name.field_2._8_8_ + 10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"CAN_ADD",&local_2c9);
    peVar5 = std::__shared_ptr_access<TCPServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TCPServer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_110);
    iVar3 = TCPServer::get_port(peVar5);
    ::dto::create((Complex *)local_2a8,uVar1,&local_2c8,(string *)((long)&ok.payload.field_2 + 8),
                  (long)iVar3);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    ::dto::Complex::Complex(&local_310,(Complex *)local_2a8);
    respond<dto::Complex>(this,poll,&local_310);
    ::dto::Complex::~Complex(&local_310);
    this_03 = std::operator<<((ostream *)&std::cout,
                              "UDPServer: created file upload tcp server listening on port ");
    peVar5 = std::__shared_ptr_access<TCPServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TCPServer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_110);
    iVar3 = TCPServer::get_port(peVar5);
    this_04 = (void *)std::ostream::operator<<(this_03,iVar3);
    std::ostream::operator<<(this_04,std::endl<char,std::char_traits<char>>);
    ::dto::Complex::~Complex((Complex *)local_2a8);
    std::__cxx11::string::~string((string *)(ok.payload.field_2._M_local_buf + 8));
    std::shared_ptr<Alarm>::~shared_ptr((shared_ptr<Alarm> *)(local_1ec + 4));
    std::weak_ptr<TCPServer>::~weak_ptr
              ((weak_ptr<TCPServer> *)
               &alarm.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<TCPServer>::~shared_ptr((shared_ptr<TCPServer> *)local_110);
    std::shared_ptr<SharedDirectory>::~shared_ptr
              ((shared_ptr<SharedDirectory> *)
               &tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    uVar1 = *(uint64_t *)(file_name.field_2._8_8_ + 10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"NO_WAY",&local_a9);
    ::dto::create((Simple *)local_88,uVar1,&local_a8,(string *)local_40);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    ::dto::Simple::Simple(&local_e8,(Simple *)local_88);
    respond<dto::Simple>(this,poll,&local_e8);
    ::dto::Simple::~Simple(&local_e8);
    ::dto::Simple::~Simple((Simple *)local_88);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void UDPServer::on_upload(Poll &poll, dto::Complex &complex) {
  std::string file_name = complex.payload;
  if (!dir->can_create_file(complex.header.param, file_name)) {
    auto dto = dto::create(complex.header.cmd_seq, "NO_WAY", file_name);
    respond(poll, dto);
    return;
  }
  dir->reserve_file(file_name, complex.header.param);
  std::shared_ptr<SharedDirectory> sdir = this->dir;

  auto tcp = std::make_shared<TCPServer>(
      std::string("FileUploadServer-") + file_name,
      FileReceiveSession::create_session_factory(dir->path_in_dir(file_name))
  );
  poll.subscribe(tcp);
  std::weak_ptr<TCPServer> server = tcp;
  auto alarm = std::make_shared<Alarm>(timeout * 1000, [server, &poll, file_name, sdir]() -> void {
    if (!server.expired()) {
      poll.unsubscribe(*server.lock());
      sdir->cancel_reserved_file(file_name);
    }
  });
  poll.subscribe_alarm(alarm);
  std::string nil;
  auto ok = dto::create(complex.header.cmd_seq, "CAN_ADD", nil, tcp->get_port());
  respond(poll, ok);
  std::cout << "UDPServer: created file upload tcp server listening on port " << tcp->get_port() << std::endl;
}